

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

void lj_crecord_tonumber(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  CTState *cts;
  TRef TVar2;
  CType *pCVar3;
  long lVar4;
  
  cts = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  pCVar3 = lj_ctype_rawref(cts,(uint)*(ushort *)((rd->argv->u64 & 0x7fffffffffff) + 10));
  if ((pCVar3->info & 0xf0000000) == 0x50000000) {
    pCVar3 = (CType *)((long)&cts->tab->info + (ulong)((pCVar3->info & 0xffff) * 0x18));
  }
  uVar1 = pCVar3->info;
  if (uVar1 < 0x10000000 || (uVar1 & 0xf4000000) == 0x34000000) {
    if ((((uVar1 & 0xf4000000) != 0) || (4 < pCVar3->size)) ||
       (lVar4 = 0xd8, (uVar1 >> 0x17 & 1) != 0 && pCVar3->size == 4)) {
      lVar4 = 0x150;
    }
    TVar2 = crec_ct_tv(J,(CType *)((long)&cts->tab->info + lVar4),0,*J->base,rd->argv);
  }
  else {
    argv2cdata(J,*J->base,rd->argv);
    TVar2 = 0x7fff;
  }
  *J->base = TVar2;
  return;
}

Assistant:

void LJ_FASTCALL lj_crecord_tonumber(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CType *d, *ct = lj_ctype_rawref(cts, cdataV(&rd->argv[0])->ctypeid);
  if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
  if (ctype_isnum(ct->info) || ctype_iscomplex(ct->info)) {
    if (ctype_isinteger_or_bool(ct->info) && ct->size <= 4 &&
	!(ct->size == 4 && (ct->info & CTF_UNSIGNED)))
      d = ctype_get(cts, CTID_INT32);
    else
      d = ctype_get(cts, CTID_DOUBLE);
    J->base[0] = crec_ct_tv(J, d, 0, J->base[0], &rd->argv[0]);
  } else {
    /* Specialize to the ctype that couldn't be converted. */
    argv2cdata(J, J->base[0], &rd->argv[0]);
    J->base[0] = TREF_NIL;
  }
}